

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

void __thiscall
spatial_region::f_init_focused
          (spatial_region *this,double a0y,double a0z,double xsigma,double sigma0,double x0,
          double x1,bool b_sign,double phase,double y0,double z0,bool append,double phi,int sscos,
          double K,double xtarget,double ytarget,double ztarget)

{
  undefined8 *puVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  int iVar92;
  int iVar93;
  celle *pcVar94;
  cellb *pcVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  undefined1 auVar99 [16];
  double dVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined8 uVar103;
  double dVar104;
  bool bVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  uint uVar126;
  long lVar127;
  int i;
  long lVar128;
  int j;
  long lVar129;
  int k;
  long lVar130;
  double dVar131;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  undefined8 in_XMM0_Qb;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined8 extraout_XMM0_Qb_04;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined1 auVar235 [64];
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  undefined1 auVar236 [64];
  double dVar237;
  double dVar238;
  undefined8 in_XMM1_Qb;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  double dVar285;
  double dVar286;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  double dVar320;
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  ulong uVar333;
  ulong in_XMM4_Qb;
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 in_register_00001348 [56];
  undefined1 auVar341 [16];
  undefined8 in_XMM7_Qb;
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined8 in_XMM13_Qb;
  undefined1 auVar349 [16];
  undefined1 in_XMM16 [16];
  undefined1 local_388 [48];
  undefined1 local_358 [16];
  double local_320;
  double local_308;
  double local_2d8;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  ulong local_2a8;
  ulong local_268;
  double local_258;
  double local_248;
  undefined8 uStack_240;
  double local_238;
  double local_228;
  double local_208;
  undefined1 local_1f8 [16];
  undefined1 local_1d8 [16];
  double local_1b8;
  double dStack_1b0;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined1 local_118 [16];
  double local_88;
  double dStack_80;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar319 [64];
  
  auVar319._8_56_ = in_register_00001348;
  auVar319._0_8_ = x1;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = z0;
  local_388._8_8_ = in_XMM0_Qb;
  local_388._0_8_ = a0y;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = y0 * y0;
  auVar287 = vfmadd213sd_fma(auVar319._0_16_,auVar319._0_16_,auVar287);
  auVar287 = vfmadd231sd_fma(auVar287,auVar239,auVar239);
  auVar287 = vsqrtsd_avx(auVar287,auVar287);
  dVar96 = sigma0 * K * sigma0 * 0.5;
  uVar103 = vcmpsd_avx512f(auVar287,ZEXT816(0),0);
  bVar105 = (bool)((byte)uVar103 & 1);
  dVar104 = (double)((ulong)bVar105 * (long)this->dx + (ulong)!bVar105 * auVar287._0_8_);
  dVar320 = dVar104 * dVar104;
  dVar137 = (dVar320 / dVar96) / dVar96 + 1.0;
  if (dVar137 < 0.0) {
    dVar137 = sqrt(dVar137);
  }
  else {
    auVar132._8_8_ = 0;
    auVar132._0_8_ = dVar137;
    auVar287 = vsqrtsd_avx(auVar132,auVar132);
    dVar137 = auVar287._0_8_;
  }
  dVar138 = dVar320 / (sigma0 * sigma0 * sigma0 * sigma0 * 0.25) + 1.0;
  if (dVar138 < 0.0) {
    dVar138 = sqrt(dVar138);
  }
  else {
    auVar150._8_8_ = 0;
    auVar150._0_8_ = dVar138;
    auVar287 = vsqrtsd_avx(auVar150,auVar150);
    dVar138 = auVar287._0_8_;
  }
  auVar102._8_8_ = in_XMM7_Qb;
  auVar102._0_8_ = y0;
  auVar321._8_8_ = 0;
  auVar321._0_8_ = y0 * y0;
  dVar97 = dVar96 * dVar96;
  dVar98 = xsigma * 0.822;
  dVar139 = ((xsigma + xsigma) * 2.5066282746310002) / 3.0;
  dVar131 = (double)((ulong)(sscos == 1) * (long)dVar98 + (ulong)(sscos != 1) * (long)dVar139);
  auVar288._8_8_ = 0;
  auVar288._0_8_ = z0;
  iVar92 = this->ny;
  dVar4 = this->dy;
  iVar93 = this->nz;
  dVar5 = this->dz;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = dVar104;
  auVar239 = vfmsub231sd_fma(auVar321,auVar99,auVar99);
  auVar287 = vunpcklpd_avx(auVar102,auVar288);
  auVar101._8_8_ = 0x8000000000000000;
  auVar101._0_8_ = 0x8000000000000000;
  auVar132 = vxorpd_avx512vl(auVar287,auVar101);
  auVar287 = vshufps_avx(auVar132,auVar132,0x4e);
  auVar287 = vfmadd213sd_fma(auVar287,auVar288,auVar239);
  if (auVar287._0_8_ < 0.0) {
    dVar140 = sqrt(auVar287._0_8_);
  }
  else {
    auVar287 = vsqrtsd_avx(auVar287,auVar287);
    dVar140 = auVar287._0_8_;
  }
  dVar237 = (sigma0 * 0.5) / 0.29356228701531506;
  uVar126 = 0;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = dVar320 / dVar97 + 1.0;
  auVar150 = vsqrtsd_avx(auVar339,auVar339);
  auVar239 = vmovhpd_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  auVar342._0_8_ = (dVar140 * (double)(int)-(((0.0 < x1) - 1) + (uint)(0.0 < x1))) / dVar104;
  auVar342._8_8_ = 0;
  auVar151._8_8_ = dVar104;
  auVar151._0_8_ = dVar104;
  auVar287 = vdivpd_avx(auVar132,auVar151);
  dVar320 = auVar287._0_8_;
  auVar134._0_8_ = -dVar320;
  auVar134._8_8_ = auVar287._8_8_ ^ 0x8000000000000000;
  auVar101 = vunpcklpd_avx(auVar134,auVar342);
  auVar152._8_8_ = 0;
  auVar152._0_8_ = dVar320 * dVar320;
  auVar132 = vfmadd231sd_fma(auVar152,auVar342,auVar342);
  auVar132 = vsqrtsd_avx(auVar132,auVar132);
  auVar153._0_8_ = auVar132._0_8_;
  auVar153._8_8_ = auVar153._0_8_;
  if (auVar153._0_8_ != 0.0) {
    uVar126 = 0xff;
  }
  if (NAN(auVar153._0_8_)) {
    uVar126 = 0xff;
  }
  auVar132 = vdivpd_avx512vl(auVar101,auVar153);
  bVar105 = (bool)((byte)uVar126 & 1);
  auVar133._0_8_ = (double)((ulong)bVar105 * auVar132._0_8_ | (ulong)!bVar105 * auVar239._0_8_);
  bVar105 = (bool)((byte)(uVar126 >> 1) & 1);
  auVar133._8_8_ = (double)((ulong)bVar105 * auVar132._8_8_ | (ulong)!bVar105 * auVar239._8_8_);
  auVar239 = vshufpd_avx(auVar287,auVar287,1);
  auVar132 = vshufpd_avx(auVar133,auVar342,1);
  auVar102 = vunpcklpd_avx(ZEXT816(0) << 0x40,auVar133);
  auVar101 = vshufpd_avx(auVar133,auVar133,1);
  auVar154._0_8_ = auVar132._0_8_ * -auVar239._0_8_;
  auVar154._8_8_ = auVar132._8_8_ * -0.0;
  auVar102 = vfmadd213pd_fma(auVar102,auVar287,auVar154);
  auVar322._8_8_ = 0;
  auVar322._0_8_ = auVar133._0_8_ * dVar320;
  local_1f8 = vfmsub213sd_fma(auVar101,auVar342,auVar322);
  if ((phi != 0.0) || (NAN(phi))) {
    dVar140 = cos(phi);
    dVar141 = sin(phi);
    auVar109._8_8_ = extraout_XMM0_Qb;
    auVar109._0_8_ = dVar140;
    auVar323._8_8_ = dVar140;
    auVar323._0_8_ = dVar140;
    auVar240._8_8_ = 0;
    auVar240._0_8_ = local_1f8._0_8_ * dVar141;
    auVar101 = vfmadd213sd_fma(ZEXT816(0) << 0x40,auVar109,auVar240);
    local_320 = auVar101._0_8_;
    auVar289._0_8_ = auVar102._0_8_ * dVar141;
    auVar289._8_8_ = auVar102._8_8_ * dVar141;
    auVar241._0_8_ = auVar133._0_8_ * dVar141;
    auVar241._8_8_ = auVar133._8_8_ * dVar141;
    auVar133 = vfmadd231pd_fma(auVar289,auVar133,auVar323);
    auVar102 = vfmsub231pd_fma(auVar241,auVar102,auVar323);
    auVar155._8_8_ = 0;
    auVar155._0_8_ = dVar141 * -0.0;
    local_1f8 = vfmadd231sd_fma(auVar155,local_1f8,auVar109);
  }
  else {
    local_320 = 0.0;
  }
  lVar128 = 0;
  auVar344._0_8_ = -x0;
  auVar344._8_8_ = in_XMM4_Qb ^ 0x8000000000000000;
  dVar4 = (double)iVar92 * dVar4 * -0.5;
  dVar5 = (double)iVar93 * dVar5 * -0.5;
  dVar140 = dVar104 / dVar96;
  dVar141 = 3.141592653589793 / dVar139;
  dVar142 = -dVar141;
  dVar238 = -K;
  dVar98 = dVar98 * dVar98 * dVar98 * dVar98;
  auVar132 = vshufpd_avx(auVar132,auVar287,1);
  auVar101 = vshufpd_avx(auVar102,auVar102,1);
  auVar99 = vshufpd_avx(auVar133,auVar133,1);
  auVar123._8_8_ = in_XMM1_Qb;
  auVar123._0_8_ = a0z;
  auVar288 = vunpcklpd_avx(auVar123,local_388._0_16_);
  do {
    if (this->nx <= lVar128) {
      return;
    }
    dVar285 = (double)(int)lVar128;
    auVar319 = ZEXT1664(CONCAT88(in_XMM13_Qb,dVar285));
    for (lVar129 = 0; lVar129 < this->ny; lVar129 = lVar129 + 1) {
      auVar334._0_8_ = (double)(int)lVar129;
      auVar334._8_8_ = in_XMM13_Qb;
      lVar127 = 0;
      auVar338 = auVar334;
      for (lVar130 = 0; lVar130 < this->nz; lVar130 = lVar130 + 1) {
        auVar156._8_8_ = 0;
        auVar156._0_8_ = this->dx;
        auVar321 = vfmadd213sd_fma(auVar156,auVar319._0_16_,auVar344);
        auVar290._8_8_ = 0;
        auVar290._0_8_ = this->dz;
        dVar147 = auVar321._0_8_ - xtarget;
        auVar157._8_8_ = 0;
        auVar157._0_8_ = this->dy;
        auVar346._8_8_ = 0;
        auVar346._0_8_ = dVar4;
        auVar321 = vfmadd213sd_fma(auVar157,auVar338,auVar346);
        dVar143 = (auVar321._0_8_ - y0) - ytarget;
        auVar321 = vcvtsi2sd_avx512f(in_XMM16,(int)lVar130);
        auVar158._8_8_ = 0;
        auVar158._0_8_ = dVar143 * dVar143;
        auVar242._8_8_ = 0;
        auVar242._0_8_ = dVar147;
        auVar152 = vfmadd231sd_fma(auVar158,auVar242,auVar242);
        auVar348._8_8_ = 0;
        auVar348._0_8_ = dVar5;
        auVar151 = vfmadd213sd_fma(auVar290,auVar321,auVar348);
        auVar243._8_8_ = 0;
        auVar243._0_8_ = dVar147;
        auVar345._8_8_ = 0;
        auVar345._0_8_ = dVar143 * dVar320;
        auVar153 = vfmadd231sd_fma(auVar345,auVar342,auVar243);
        dVar147 = (auVar151._0_8_ - z0) - ztarget;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = auVar239._0_8_;
        auVar291._8_8_ = 0;
        auVar291._0_8_ = dVar147;
        auVar151 = vfmadd231sd_fma(auVar153,auVar291,auVar6);
        auVar292._8_8_ = 0;
        auVar292._0_8_ = dVar147;
        auVar152 = vfmadd231sd_fma(auVar152,auVar291,auVar292);
        dVar147 = auVar151._0_8_;
        auVar151 = vfnmadd231sd_fma(auVar152,auVar151,auVar151);
        uVar333 = auVar321._0_8_;
        if (auVar151._0_8_ < 0.0) {
          dVar143 = sqrt(auVar151._0_8_);
        }
        else {
          auVar321 = vsqrtsd_avx(auVar151,auVar151);
          dVar143 = auVar321._0_8_;
        }
        dVar100 = dVar147 - dVar104;
        auVar244._8_8_ = 0;
        auVar244._0_8_ = dVar100;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = dVar97;
        auVar321 = vfmadd213sd_fma(auVar244,auVar244,auVar7);
        dVar286 = auVar321._0_8_;
        dVar144 = atan(dVar100 / dVar96);
        dVar145 = atan(dVar140);
        dVar145 = ((dVar147 + (dVar143 * dVar143 * 0.5 * dVar100) / dVar286) - dVar144) - dVar145;
        local_388._0_8_ = dVar145 - dVar104;
        dVar144 = atan(dVar140);
        dVar146 = atan(dVar140);
        dVar144 = ((dVar146 + (double)local_388._0_8_) * (dVar144 + (double)local_388._0_8_)) /
                  dVar97 + 1.0;
        if (dVar144 < 0.0) {
          dVar144 = sqrt(dVar144);
        }
        else {
          auVar159._8_8_ = 0;
          auVar159._0_8_ = dVar144;
          auVar321 = vsqrtsd_avx(auVar159,auVar159);
          dVar144 = auVar321._0_8_;
        }
        if ((dVar145 <= -dVar131) || (dVar131 <= dVar145)) {
LAB_0010ebcd:
          if (!append) {
            pcVar94 = (this->ce).p._M_t.
                      super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                      super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar128][lVar129];
            puVar1 = (undefined8 *)((long)&pcVar94->ex + lVar127);
            *puVar1 = 0;
            puVar1[1] = 0;
            *(undefined8 *)((long)&pcVar94->ez + lVar127) = 0;
            pcVar95 = (this->cb).p._M_t.
                      super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                      super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar128][lVar129];
            *(undefined8 *)((long)&pcVar95->bz + lVar127) = 0;
            puVar1 = (undefined8 *)((long)&pcVar95->bx + lVar127);
            *puVar1 = 0;
            puVar1[1] = 0;
          }
        }
        else {
          dVar144 = dVar144 * dVar237;
          in_XMM13_Qb = 0;
          if (dVar144 <= dVar143) goto LAB_0010ebcd;
          dVar146 = (((dVar137 * sigma0 * 0.5) / 0.29356228701531506) / dVar144) *
                    (dVar138 / auVar150._0_8_);
          local_248 = auVar99._0_8_;
          local_88 = auVar288._0_8_;
          dStack_80 = auVar288._8_8_;
          local_1b8 = auVar133._0_8_;
          local_228 = auVar101._0_8_;
          local_2a8 = auVar102._0_8_;
          uStack_240 = auVar99._8_8_;
          if (sscos == 1) {
            dVar147 = (dVar145 * dVar145 * dVar145 * dVar145 * 3.141592653589793 * 0.5) / dVar98;
            local_358._0_8_ = cos(dVar147);
            local_358._8_8_ = extraout_XMM0_Qb_00;
            dVar148 = (dVar143 * 3.141592653589793 * 0.5) / dVar144;
            local_2d8 = cos(dVar148);
            local_238 = sin(dVar147);
            dVar149 = sin(dVar148);
            auVar245._8_8_ = 0;
            auVar245._0_8_ = dVar145;
            auVar160._8_8_ = 0;
            auVar160._0_8_ = K;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = phase;
            auVar321 = vfmadd213sd_fma(auVar245,auVar160,auVar8);
            local_388._0_8_ = auVar321._0_8_;
            dVar148 = cos((double)local_388._0_8_);
            dVar147 = (dVar145 * dVar145 * dVar145 * 12.566370614359172) / dVar98;
            local_1d8._0_8_ = sin((double)local_388._0_8_);
            local_1d8._8_8_ = extraout_XMM0_Qb_02;
            local_118._0_8_ = sin((double)local_388._0_8_);
            local_118._8_8_ = extraout_XMM0_Qb_03;
            auVar235._0_8_ = cos((double)local_388._0_8_);
            auVar235._8_56_ = extraout_var;
            auVar121._8_4_ = 0;
            auVar121._0_8_ = -dVar146;
            auVar121._12_4_ = 0x80000000;
            auVar108._8_8_ = 0;
            auVar108._0_8_ = dVar147;
            auVar112._8_4_ = 0;
            auVar112._0_8_ = -dVar147;
            auVar112._12_4_ = 0x80000000;
            auVar321 = vunpcklpd_avx(auVar235._0_16_,auVar112);
            auVar124._8_8_ = K;
            auVar124._0_8_ = K;
            auVar324._8_8_ = local_358._0_8_;
            auVar324._0_8_ = local_358._0_8_;
            auVar118._8_8_ = 0;
            auVar118._0_8_ = dVar146;
            auVar151 = vunpcklpd_avx(auVar121,auVar118);
            auVar152 = vunpcklpd_avx(auVar108,local_1d8);
            auVar341._0_8_ = auVar151._0_8_ * local_88;
            auVar341._8_8_ = auVar151._8_8_ * dStack_80;
            auVar246._0_8_ = local_2d8 * auVar341._0_8_ * local_2d8;
            auVar246._8_8_ = local_2d8 * auVar341._8_8_ * local_2d8;
            auVar114._8_8_ = extraout_XMM0_Qb_01;
            auVar114._0_8_ = dVar148;
            auVar151 = vunpcklpd_avx(local_118,auVar114);
            auVar161._0_8_ = local_238 * (double)local_358._0_8_ * auVar152._0_8_ * auVar321._0_8_;
            auVar161._8_8_ = local_238 * (double)local_358._0_8_ * auVar152._8_8_ * auVar321._8_8_;
            auVar321 = vdivpd_avx(auVar246,auVar124);
            auVar293._0_8_ = (double)local_358._0_8_ * auVar151._0_8_ * K;
            auVar293._8_8_ = (double)local_358._0_8_ * auVar151._8_8_ * K;
            auVar151 = vfmadd231pd_fma(auVar161,auVar324,auVar293);
            local_118._0_8_ = auVar321._0_8_ * auVar151._0_8_;
            local_118._8_8_ = auVar321._8_8_ * auVar151._8_8_;
            dVar148 = -(double)local_118._0_8_;
            if ((dVar143 != 0.0) || (NAN(dVar143))) {
              auVar110._8_8_ = 0;
              auVar110._0_8_ = dVar144;
              auVar151 = vunpcklpd_avx(auVar124,auVar110);
              auVar294._8_8_ = 0;
              auVar294._0_8_ = dVar4;
              local_128 = (undefined4)local_118._0_8_;
              uStack_124 = (undefined4)((ulong)dVar148 >> 0x20);
              auVar162._8_8_ = 0;
              auVar162._0_8_ = dVar149 * local_2d8 * 3.141592653589793;
              auVar321 = vshufpd_avx(auVar341,auVar162,1);
              auVar321 = vdivpd_avx(auVar321,auVar151);
              auVar163._8_8_ = 0;
              auVar163._0_8_ = this->dx;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = dVar285;
              auVar151 = vfmadd132sd_fma(auVar163,auVar344,auVar9);
              auVar247._8_8_ = 0;
              auVar247._0_8_ = this->dy;
              auVar10._8_8_ = 0;
              auVar10._0_8_ = auVar334._0_8_;
              auVar152 = vfmadd132sd_fma(auVar247,auVar294,auVar10);
              auVar295._8_8_ = 0;
              auVar295._0_8_ = uVar333;
              auVar11._8_8_ = 0;
              auVar11._0_8_ = local_1b8;
              auVar164._8_8_ = 0;
              auVar164._0_8_ = auVar151._0_8_ - xtarget;
              auVar248._8_8_ = 0;
              auVar248._0_8_ = ((auVar152._0_8_ - y0) - ytarget) * local_248;
              auVar152 = vfmadd231sd_fma(auVar248,auVar164,auVar11);
              auVar165._8_8_ = 0;
              auVar165._0_8_ = this->dz;
              auVar12._8_8_ = 0;
              auVar12._0_8_ = dVar5;
              auVar151 = vfmadd213sd_fma(auVar165,auVar295,auVar12);
              auVar13._8_8_ = 0;
              auVar13._0_8_ = local_320;
              auVar166._8_8_ = 0;
              auVar166._0_8_ = (auVar151._0_8_ - z0) - ztarget;
              auVar152 = vfmadd132sd_fma(auVar166,auVar152,auVar13);
              auVar151 = vshufpd_avx(auVar321,auVar321,1);
              dVar144 = sin((double)local_388._0_8_);
              dVar145 = cos((double)local_388._0_8_);
              auVar296._8_8_ = 0;
              auVar296._0_8_ = dVar4;
              auVar14._8_8_ = 0;
              auVar14._0_8_ = dVar144 * K * (double)local_358._0_8_;
              auVar167._8_8_ = 0;
              auVar167._0_8_ = (double)local_358._0_8_ * dVar145 * dVar147 * local_238;
              auVar339 = vfmadd231sd_fma(auVar167,local_358,auVar14);
              auVar168._8_8_ = 0;
              auVar168._0_8_ = this->dx;
              auVar15._8_8_ = 0;
              auVar15._0_8_ = dVar285;
              auVar153 = vfmadd132sd_fma(auVar168,auVar344,auVar15);
              auVar249._8_8_ = 0;
              auVar249._0_8_ = this->dy;
              auVar16._8_8_ = 0;
              auVar16._0_8_ = auVar334._0_8_;
              auVar134 = vfmadd132sd_fma(auVar249,auVar296,auVar16);
              auVar297._8_8_ = 0;
              auVar297._0_8_ = uVar333;
              auVar17._8_8_ = 0;
              auVar17._0_8_ = local_1b8;
              auVar169._8_8_ = 0;
              auVar169._0_8_ = auVar153._0_8_ - xtarget;
              auVar250._8_8_ = 0;
              auVar250._0_8_ = ((auVar134._0_8_ - y0) - ytarget) * local_248;
              auVar134 = vfmadd231sd_fma(auVar250,auVar169,auVar17);
              auVar170._8_8_ = 0;
              auVar170._0_8_ = this->dz;
              auVar18._8_8_ = 0;
              auVar18._0_8_ = dVar5;
              auVar153 = vfmadd213sd_fma(auVar170,auVar297,auVar18);
              auVar19._8_8_ = 0;
              auVar19._0_8_ = local_320;
              auVar171._8_8_ = 0;
              auVar171._0_8_ = (auVar153._0_8_ - z0) - ztarget;
              auVar153 = vfmadd132sd_fma(auVar171,auVar134,auVar19);
              local_308 = (double)local_358._0_8_ * (double)local_358._0_8_;
              dVar144 = cos((double)local_388._0_8_);
              local_258 = dVar147 * (double)local_358._0_8_ * local_238;
              dVar145 = sin((double)local_388._0_8_);
              auVar251._8_8_ = 0;
              auVar251._0_8_ = dVar144 * dVar238;
              auVar298._8_8_ = 0;
              auVar298._0_8_ = dVar4;
              auVar20._8_8_ = 0;
              auVar20._0_8_ = local_308;
              auVar172._8_8_ = 0;
              auVar172._0_8_ = dVar145 * local_258;
              auVar134 = vfmadd231sd_fma(auVar172,auVar251,auVar20);
              auVar252._8_8_ = 0;
              auVar252._0_8_ = auVar339._0_8_;
              auVar21._8_8_ = 0;
              auVar21._0_8_ = (auVar151._0_8_ * auVar152._0_8_) / dVar143;
              auVar173._8_8_ = 0;
              auVar173._0_8_ =
                   auVar134._0_8_ * local_2d8 * local_2d8 * ((auVar153._0_8_ * dVar100) / dVar286);
              auVar339 = vfmadd231sd_fma(auVar173,auVar252,auVar21);
              auVar174._8_8_ = 0;
              auVar174._0_8_ = this->dx;
              auVar22._8_8_ = 0;
              auVar22._0_8_ = dVar285;
              auVar152 = vfmadd132sd_fma(auVar174,auVar344,auVar22);
              auVar253._8_8_ = 0;
              auVar253._0_8_ = this->dy;
              auVar23._8_8_ = 0;
              auVar23._0_8_ = auVar334._0_8_;
              auVar153 = vfmadd132sd_fma(auVar253,auVar298,auVar23);
              auVar299._8_8_ = 0;
              auVar299._0_8_ = uVar333;
              auVar24._8_8_ = 0;
              auVar24._0_8_ = local_2a8;
              auVar175._8_8_ = 0;
              auVar175._0_8_ = auVar152._0_8_ - xtarget;
              auVar254._8_8_ = 0;
              auVar254._0_8_ = ((auVar153._0_8_ - y0) - ytarget) * local_228;
              auVar153 = vfmadd231sd_fma(auVar254,auVar175,auVar24);
              auVar176._8_8_ = 0;
              auVar176._0_8_ = this->dz;
              auVar25._8_8_ = 0;
              auVar25._0_8_ = dVar5;
              auVar152 = vfmadd213sd_fma(auVar176,auVar299,auVar25);
              auVar26._8_8_ = 0;
              auVar26._0_8_ = local_1f8._0_8_;
              auVar177._8_8_ = 0;
              auVar177._0_8_ = (auVar152._0_8_ - z0) - ztarget;
              auVar152 = vfmadd132sd_fma(auVar177,auVar153,auVar26);
              dVar144 = cos((double)local_388._0_8_);
              dVar145 = sin((double)local_388._0_8_);
              auVar300._8_8_ = 0;
              auVar300._0_8_ = dVar4;
              auVar27._8_8_ = 0;
              auVar27._0_8_ = dVar144 * dVar238 * (double)local_358._0_8_;
              auVar178._8_8_ = 0;
              auVar178._0_8_ = (double)local_358._0_8_ * dVar145 * -dVar147 * local_238;
              auVar154 = vfmadd231sd_fma(auVar178,local_358,auVar27);
              auVar179._8_8_ = 0;
              auVar179._0_8_ = this->dx;
              auVar28._8_8_ = 0;
              auVar28._0_8_ = dVar285;
              auVar153 = vfmadd132sd_fma(auVar179,auVar344,auVar28);
              auVar255._8_8_ = 0;
              auVar255._0_8_ = this->dy;
              auVar29._8_8_ = 0;
              auVar29._0_8_ = auVar334._0_8_;
              auVar134 = vfmadd132sd_fma(auVar255,auVar300,auVar29);
              auVar301._8_8_ = 0;
              auVar301._0_8_ = uVar333;
              auVar30._8_8_ = 0;
              auVar30._0_8_ = local_2a8;
              auVar180._8_8_ = 0;
              auVar180._0_8_ = auVar153._0_8_ - xtarget;
              auVar256._8_8_ = 0;
              auVar256._0_8_ = ((auVar134._0_8_ - y0) - ytarget) * local_228;
              auVar134 = vfmadd231sd_fma(auVar256,auVar180,auVar30);
              auVar181._8_8_ = 0;
              auVar181._0_8_ = this->dz;
              auVar31._8_8_ = 0;
              auVar31._0_8_ = dVar5;
              auVar153 = vfmadd213sd_fma(auVar181,auVar301,auVar31);
              auVar32._8_8_ = 0;
              auVar32._0_8_ = local_1f8._0_8_;
              auVar182._8_8_ = 0;
              auVar182._0_8_ = (auVar153._0_8_ - z0) - ztarget;
              auVar153 = vfmadd132sd_fma(auVar182,auVar134,auVar32);
              dVar144 = sin((double)local_388._0_8_);
              dVar145 = cos((double)local_388._0_8_);
              auVar115._8_8_ = 0;
              auVar115._0_8_ = local_258;
              auVar106._8_8_ = 0x8000000000000000;
              auVar106._0_8_ = 0x8000000000000000;
              auVar134 = vxorpd_avx512vl(auVar115,auVar106);
              local_208 = auVar134._0_8_;
              auVar257._8_8_ = 0;
              auVar257._0_8_ = dVar144 * dVar238;
              auVar33._8_8_ = 0;
              auVar33._0_8_ = local_308;
              auVar183._8_8_ = 0;
              auVar183._0_8_ = dVar145 * local_258;
              auVar134 = vfmsub231sd_fma(auVar183,auVar257,auVar33);
              auVar258._8_8_ = 0;
              auVar258._0_8_ = auVar154._0_8_;
              auVar34._8_8_ = 0;
              auVar34._0_8_ = (auVar152._0_8_ * auVar151._0_8_) / dVar143;
              auVar184._8_8_ = 0;
              auVar184._0_8_ =
                   auVar134._0_8_ * local_2d8 * local_2d8 * ((auVar153._0_8_ * dVar100) / dVar286);
              auVar151 = vfmadd231sd_fma(auVar184,auVar258,auVar34);
              auVar35._8_8_ = 0;
              auVar35._0_8_ = auVar339._0_8_;
              auVar185._8_8_ = 0;
              auVar185._0_8_ = (auVar341._0_8_ / K) * auVar151._0_8_;
              auVar151 = vfmadd231sd_fma(auVar185,auVar321,auVar35);
              local_268 = auVar151._0_8_;
              dVar144 = -dVar147;
LAB_0010e703:
              auVar186._8_8_ = 0;
              auVar186._0_8_ = this->dx;
              auVar325._8_8_ = 0;
              auVar325._0_8_ = auVar334._0_8_;
              auVar36._8_8_ = 0;
              auVar36._0_8_ = dVar285;
              auVar151 = vfmadd132sd_fma(auVar186,auVar344,auVar36);
              auVar259._8_8_ = 0;
              auVar259._0_8_ = this->dy;
              auVar37._8_8_ = 0;
              auVar37._0_8_ = dVar4;
              auVar152 = vfmadd213sd_fma(auVar259,auVar325,auVar37);
              auVar326._8_8_ = 0;
              auVar326._0_8_ = uVar333;
              auVar38._8_8_ = 0;
              auVar38._0_8_ = local_2a8;
              auVar187._8_8_ = 0;
              auVar187._0_8_ = auVar151._0_8_ - xtarget;
              auVar260._8_8_ = 0;
              auVar260._0_8_ = ((auVar152._0_8_ - y0) - ytarget) * local_228;
              auVar152 = vfmadd231sd_fma(auVar260,auVar187,auVar38);
              auVar188._8_8_ = 0;
              auVar188._0_8_ = this->dz;
              auVar39._8_8_ = 0;
              auVar39._0_8_ = dVar5;
              auVar151 = vfmadd213sd_fma(auVar188,auVar326,auVar39);
              auVar40._8_8_ = 0;
              auVar40._0_8_ = local_1f8._0_8_;
              auVar189._8_8_ = 0;
              auVar189._0_8_ = (auVar151._0_8_ - z0) - ztarget;
              auVar152 = vfmadd132sd_fma(auVar189,auVar152,auVar40);
              auVar151 = vshufpd_avx(auVar321,auVar321,1);
              dVar145 = sin((double)local_388._0_8_);
              dVar148 = cos((double)local_388._0_8_);
              auVar302._8_8_ = 0;
              auVar302._0_8_ = auVar334._0_8_;
              auVar41._8_8_ = 0;
              auVar41._0_8_ = dVar145 * K * (double)local_358._0_8_;
              auVar190._8_8_ = 0;
              auVar190._0_8_ = (double)local_358._0_8_ * dVar148 * dVar147 * local_238;
              auVar339 = vfmadd231sd_fma(auVar190,local_358,auVar41);
              auVar191._8_8_ = 0;
              auVar191._0_8_ = this->dx;
              auVar42._8_8_ = 0;
              auVar42._0_8_ = dVar285;
              auVar153 = vfmadd132sd_fma(auVar191,auVar344,auVar42);
              auVar261._8_8_ = 0;
              auVar261._0_8_ = this->dy;
              auVar43._8_8_ = 0;
              auVar43._0_8_ = dVar4;
              auVar134 = vfmadd213sd_fma(auVar261,auVar302,auVar43);
              auVar303._8_8_ = 0;
              auVar303._0_8_ = uVar333;
              auVar44._8_8_ = 0;
              auVar44._0_8_ = local_2a8;
              auVar192._8_8_ = 0;
              auVar192._0_8_ = auVar153._0_8_ - xtarget;
              auVar262._8_8_ = 0;
              auVar262._0_8_ = ((auVar134._0_8_ - y0) - ytarget) * local_228;
              auVar134 = vfmadd231sd_fma(auVar262,auVar192,auVar44);
              auVar193._8_8_ = 0;
              auVar193._0_8_ = this->dz;
              auVar45._8_8_ = 0;
              auVar45._0_8_ = dVar5;
              auVar153 = vfmadd213sd_fma(auVar193,auVar303,auVar45);
              auVar46._8_8_ = 0;
              auVar46._0_8_ = local_1f8._0_8_;
              auVar194._8_8_ = 0;
              auVar194._0_8_ = (auVar153._0_8_ - z0) - ztarget;
              auVar153 = vfmadd132sd_fma(auVar194,auVar134,auVar46);
              dVar147 = cos((double)local_388._0_8_);
              dVar145 = sin((double)local_388._0_8_);
              auVar263._8_8_ = 0;
              auVar263._0_8_ = dVar147 * dVar238;
              auVar304._8_8_ = 0;
              auVar304._0_8_ = auVar334._0_8_;
              auVar47._8_8_ = 0;
              auVar47._0_8_ = local_308;
              auVar195._8_8_ = 0;
              auVar195._0_8_ = dVar145 * local_258;
              auVar134 = vfmadd231sd_fma(auVar195,auVar263,auVar47);
              auVar264._8_8_ = 0;
              auVar264._0_8_ = auVar339._0_8_;
              auVar48._8_8_ = 0;
              auVar48._0_8_ = (auVar151._0_8_ * auVar152._0_8_) / dVar143;
              auVar196._8_8_ = 0;
              auVar196._0_8_ =
                   auVar134._0_8_ * local_2d8 * local_2d8 * ((auVar153._0_8_ * dVar100) / dVar286);
              auVar152 = vfmadd231sd_fma(auVar196,auVar264,auVar48);
              auVar208._0_8_ = auVar152._0_8_;
              auVar197._8_8_ = 0;
              auVar197._0_8_ = this->dx;
              auVar49._8_8_ = 0;
              auVar49._0_8_ = dVar285;
              auVar152 = vfmadd132sd_fma(auVar197,auVar344,auVar49);
              auVar265._8_8_ = 0;
              auVar265._0_8_ = this->dy;
              auVar50._8_8_ = 0;
              auVar50._0_8_ = dVar4;
              auVar153 = vfmadd213sd_fma(auVar265,auVar304,auVar50);
              auVar305._8_8_ = 0;
              auVar305._0_8_ = uVar333;
              auVar51._8_8_ = 0;
              auVar51._0_8_ = local_1b8;
              auVar198._8_8_ = 0;
              auVar198._0_8_ = auVar152._0_8_ - xtarget;
              auVar266._8_8_ = 0;
              auVar266._0_8_ = ((auVar153._0_8_ - y0) - ytarget) * local_248;
              auVar153 = vfmadd231sd_fma(auVar266,auVar198,auVar51);
              auVar199._8_8_ = 0;
              auVar199._0_8_ = this->dz;
              auVar52._8_8_ = 0;
              auVar52._0_8_ = dVar5;
              auVar152 = vfmadd213sd_fma(auVar199,auVar305,auVar52);
              auVar53._8_8_ = 0;
              auVar53._0_8_ = local_320;
              auVar200._8_8_ = 0;
              auVar200._0_8_ = (auVar152._0_8_ - z0) - ztarget;
              auVar152 = vfmadd132sd_fma(auVar200,auVar153,auVar53);
              dVar147 = cos((double)local_388._0_8_);
              dVar145 = sin((double)local_388._0_8_);
              auVar306._8_8_ = 0;
              auVar306._0_8_ = auVar334._0_8_;
              auVar54._8_8_ = 0;
              auVar54._0_8_ = dVar147 * dVar238 * (double)local_358._0_8_;
              auVar201._8_8_ = 0;
              auVar201._0_8_ = (double)local_358._0_8_ * dVar145 * dVar144 * local_238;
              auVar339 = vfmadd231sd_fma(auVar201,local_358,auVar54);
              auVar202._8_8_ = 0;
              auVar202._0_8_ = this->dx;
              auVar55._8_8_ = 0;
              auVar55._0_8_ = dVar285;
              auVar153 = vfmadd132sd_fma(auVar202,auVar344,auVar55);
              auVar267._8_8_ = 0;
              auVar267._0_8_ = this->dy;
              auVar56._8_8_ = 0;
              auVar56._0_8_ = dVar4;
              auVar134 = vfmadd213sd_fma(auVar267,auVar306,auVar56);
              auVar307._8_8_ = 0;
              auVar307._0_8_ = dVar5;
              auVar57._8_8_ = 0;
              auVar57._0_8_ = local_1b8;
              auVar203._8_8_ = 0;
              auVar203._0_8_ = auVar153._0_8_ - xtarget;
              auVar268._8_8_ = 0;
              auVar268._0_8_ = ((auVar134._0_8_ - y0) - ytarget) * local_248;
              auVar134 = vfmadd231sd_fma(auVar268,auVar203,auVar57);
              auVar204._8_8_ = 0;
              auVar204._0_8_ = uVar333;
              auVar58._8_8_ = 0;
              auVar58._0_8_ = this->dz;
              auVar153 = vfmadd132sd_fma(auVar204,auVar307,auVar58);
              auVar59._8_8_ = 0;
              auVar59._0_8_ = local_320;
              auVar205._8_8_ = 0;
              auVar205._0_8_ = (auVar153._0_8_ - z0) - ztarget;
              auVar153 = vfmadd132sd_fma(auVar205,auVar134,auVar59);
              dVar147 = sin((double)local_388._0_8_);
              dVar144 = cos((double)local_388._0_8_);
              auVar269._8_8_ = 0;
              auVar269._0_8_ = dVar147 * dVar238;
              dVar148 = (double)CONCAT44(uStack_124,local_128);
              auVar349._8_8_ = 0;
              auVar349._0_8_ = local_268;
              auVar60._8_8_ = 0;
              auVar60._0_8_ = local_308;
              auVar206._8_8_ = 0;
              auVar206._0_8_ = dVar144 * local_208;
              auVar134 = vfmadd231sd_fma(auVar206,auVar269,auVar60);
              auVar270._8_8_ = 0;
              auVar270._0_8_ = auVar339._0_8_;
              auVar61._8_8_ = 0;
              auVar61._0_8_ = (auVar152._0_8_ * auVar151._0_8_) / dVar143;
              auVar207._8_8_ = 0;
              auVar207._0_8_ =
                   auVar134._0_8_ * local_2d8 * local_2d8 * ((auVar153._0_8_ * dVar100) / dVar286);
              auVar151 = vfmadd231sd_fma(auVar207,auVar270,auVar61);
              auVar208._8_8_ = 0;
              local_1d8._0_8_ = auVar321._0_8_;
              auVar62._8_8_ = 0;
              auVar62._0_8_ = local_1d8._0_8_;
              auVar335._8_8_ = 0;
              auVar335._0_8_ = auVar151._0_8_ * ((dVar146 * a0z) / K);
              auVar321 = vfmadd231sd_fma(auVar335,auVar208,auVar62);
            }
            else {
LAB_0010f38e:
              auVar349 = SUB6416(ZEXT864(0),0) << 0x40;
              auVar321 = ZEXT816(0) << 0x40;
            }
          }
          else {
            local_118 = SUB6416(ZEXT864(0),0) << 0x40;
            auVar349 = SUB6416(ZEXT864(0),0) << 0x40;
            if (((dVar104 - dVar147) * dVar237 * -2.0) / dVar96 <= dVar143) {
              auVar321 = ZEXT816(0);
              dVar148 = 0.0;
              if (dVar143 <= ((dVar104 - dVar147) * (dVar237 + dVar237)) / dVar96) {
                dVar147 = (dVar145 * 3.141592653589793 * 0.5) / dVar139;
                local_358._0_8_ = cos(dVar147);
                local_358._8_8_ = extraout_XMM0_Qb_04;
                dVar148 = (dVar143 * 3.141592653589793 * 0.5) / dVar144;
                local_2d8 = cos(dVar148);
                local_238 = sin(dVar147);
                dVar147 = sin(dVar148);
                auVar209._8_8_ = 0;
                auVar209._0_8_ = K;
                auVar271._8_8_ = 0;
                auVar271._0_8_ = dVar145;
                auVar63._8_8_ = 0;
                auVar63._0_8_ = phase;
                auVar321 = vfmadd213sd_fma(auVar271,auVar209,auVar63);
                dVar149 = auVar321._0_8_;
                local_388._0_8_ = cos(dVar149);
                local_388._8_8_ = extraout_XMM0_Qb_05;
                dVar145 = sin(dVar149);
                uStack_2b0 = (undefined4)extraout_XMM0_Qb_06;
                uStack_2ac = (undefined4)((ulong)extraout_XMM0_Qb_06 >> 0x20);
                local_1d8._0_8_ = -dVar146;
                local_1d8._8_4_ = 0;
                local_1d8._12_4_ = 0x80000000;
                dVar148 = sin(dVar149);
                auVar236._0_8_ = cos(dVar149);
                auVar236._8_56_ = extraout_var_00;
                auVar120._8_8_ = 0;
                auVar120._0_8_ = dVar141;
                auVar122._8_8_ = 0x8000000000000000;
                auVar122._0_8_ = dVar142;
                auVar125._8_8_ = K;
                auVar125._0_8_ = K;
                auVar327._8_8_ = local_358._0_8_;
                auVar327._0_8_ = local_358._0_8_;
                auVar119._8_8_ = 0;
                auVar119._0_8_ = dVar146;
                auVar321 = vunpcklpd_avx(local_1d8,auVar119);
                auVar113._8_4_ = uStack_2b0;
                auVar113._0_8_ = dVar145;
                auVar113._12_4_ = uStack_2ac;
                auVar151 = vunpcklpd_avx(auVar120,auVar113);
                auVar343._0_8_ = auVar321._0_8_ * local_88;
                auVar343._8_8_ = auVar321._8_8_ * dStack_80;
                auVar321 = vunpcklpd_avx(auVar236._0_16_,auVar122);
                auVar272._0_8_ = local_2d8 * auVar343._0_8_ * local_2d8;
                auVar272._8_8_ = local_2d8 * auVar343._8_8_ * local_2d8;
                auVar116._8_8_ = extraout_XMM0_Qb_07;
                auVar116._0_8_ = dVar148;
                auVar152 = vunpcklpd_avx(auVar116,local_388._0_16_);
                auVar210._0_8_ =
                     local_238 * (double)local_358._0_8_ * auVar151._0_8_ * auVar321._0_8_;
                auVar210._8_8_ =
                     local_238 * (double)local_358._0_8_ * auVar151._8_8_ * auVar321._8_8_;
                auVar321 = vdivpd_avx(auVar272,auVar125);
                auVar308._0_8_ = (double)local_358._0_8_ * auVar152._0_8_ * K;
                auVar308._8_8_ = (double)local_358._0_8_ * auVar152._8_8_ * K;
                auVar151 = vfmadd231pd_fma(auVar210,auVar327,auVar308);
                local_118._0_8_ = auVar321._0_8_ * auVar151._0_8_;
                local_118._8_8_ = auVar321._8_8_ * auVar151._8_8_;
                dVar148 = -(double)local_118._0_8_;
                if ((dVar143 == 0.0) && (!NAN(dVar143))) goto LAB_0010f38e;
                auVar111._8_8_ = 0;
                auVar111._0_8_ = dVar144;
                auVar151 = vunpcklpd_avx(auVar125,auVar111);
                auVar309._8_8_ = 0;
                auVar309._0_8_ = dVar4;
                local_128 = (undefined4)local_118._0_8_;
                uStack_124 = (undefined4)((ulong)dVar148 >> 0x20);
                auVar211._8_8_ = 0;
                auVar211._0_8_ = dVar147 * local_2d8 * 3.141592653589793;
                auVar321 = vshufpd_avx(auVar343,auVar211,1);
                auVar321 = vdivpd_avx(auVar321,auVar151);
                auVar212._8_8_ = 0;
                auVar212._0_8_ = this->dx;
                auVar64._8_8_ = 0;
                auVar64._0_8_ = dVar285;
                auVar151 = vfmadd132sd_fma(auVar212,auVar344,auVar64);
                auVar273._8_8_ = 0;
                auVar273._0_8_ = this->dy;
                auVar65._8_8_ = 0;
                auVar65._0_8_ = auVar334._0_8_;
                auVar152 = vfmadd132sd_fma(auVar273,auVar309,auVar65);
                auVar310._8_8_ = 0;
                auVar310._0_8_ = uVar333;
                auVar66._8_8_ = 0;
                auVar66._0_8_ = local_1b8;
                auVar213._8_8_ = 0;
                auVar213._0_8_ = auVar151._0_8_ - xtarget;
                auVar274._8_8_ = 0;
                auVar274._0_8_ = ((auVar152._0_8_ - y0) - ytarget) * local_248;
                auVar152 = vfmadd231sd_fma(auVar274,auVar213,auVar66);
                auVar214._8_8_ = 0;
                auVar214._0_8_ = this->dz;
                auVar67._8_8_ = 0;
                auVar67._0_8_ = dVar5;
                auVar151 = vfmadd213sd_fma(auVar214,auVar310,auVar67);
                auVar68._8_8_ = 0;
                auVar68._0_8_ = local_320;
                auVar215._8_8_ = 0;
                auVar215._0_8_ = (auVar151._0_8_ - z0) - ztarget;
                auVar152 = vfmadd132sd_fma(auVar215,auVar152,auVar68);
                auVar151 = vshufpd_avx(auVar321,auVar321,1);
                dVar147 = sin(dVar149);
                dVar144 = cos(dVar149);
                auVar311._8_8_ = 0;
                auVar311._0_8_ = dVar4;
                auVar69._8_8_ = 0;
                auVar69._0_8_ = dVar147 * K * (double)local_358._0_8_;
                auVar216._8_8_ = 0;
                auVar216._0_8_ = (double)local_358._0_8_ * dVar144 * dVar141 * local_238;
                auVar339 = vfmadd231sd_fma(auVar216,local_358,auVar69);
                auVar217._8_8_ = 0;
                auVar217._0_8_ = this->dx;
                auVar70._8_8_ = 0;
                auVar70._0_8_ = dVar285;
                auVar153 = vfmadd132sd_fma(auVar217,auVar344,auVar70);
                auVar275._8_8_ = 0;
                auVar275._0_8_ = this->dy;
                auVar71._8_8_ = 0;
                auVar71._0_8_ = auVar334._0_8_;
                auVar134 = vfmadd132sd_fma(auVar275,auVar311,auVar71);
                auVar312._8_8_ = 0;
                auVar312._0_8_ = uVar333;
                auVar72._8_8_ = 0;
                auVar72._0_8_ = local_1b8;
                auVar218._8_8_ = 0;
                auVar218._0_8_ = auVar153._0_8_ - xtarget;
                auVar276._8_8_ = 0;
                auVar276._0_8_ = ((auVar134._0_8_ - y0) - ytarget) * local_248;
                auVar134 = vfmadd231sd_fma(auVar276,auVar218,auVar72);
                auVar219._8_8_ = 0;
                auVar219._0_8_ = this->dz;
                auVar73._8_8_ = 0;
                auVar73._0_8_ = dVar5;
                auVar153 = vfmadd213sd_fma(auVar219,auVar312,auVar73);
                auVar74._8_8_ = 0;
                auVar74._0_8_ = local_320;
                auVar220._8_8_ = 0;
                auVar220._0_8_ = (auVar153._0_8_ - z0) - ztarget;
                auVar153 = vfmadd132sd_fma(auVar220,auVar134,auVar74);
                local_308 = (double)local_358._0_8_ * (double)local_358._0_8_;
                dVar147 = cos(dVar149);
                local_258 = (double)local_358._0_8_ * dVar141 * local_238;
                dVar144 = sin(dVar149);
                auVar277._8_8_ = 0;
                auVar277._0_8_ = dVar147 * dVar238;
                auVar313._8_8_ = 0;
                auVar313._0_8_ = dVar4;
                auVar75._8_8_ = 0;
                auVar75._0_8_ = local_308;
                auVar221._8_8_ = 0;
                auVar221._0_8_ = dVar144 * local_258;
                auVar134 = vfmadd231sd_fma(auVar221,auVar277,auVar75);
                auVar278._8_8_ = 0;
                auVar278._0_8_ = auVar339._0_8_;
                auVar76._8_8_ = 0;
                auVar76._0_8_ = (auVar151._0_8_ * auVar152._0_8_) / dVar143;
                auVar222._8_8_ = 0;
                auVar222._0_8_ =
                     auVar134._0_8_ * local_2d8 * local_2d8 * ((auVar153._0_8_ * dVar100) / dVar286)
                ;
                auVar339 = vfmadd231sd_fma(auVar222,auVar278,auVar76);
                auVar223._8_8_ = 0;
                auVar223._0_8_ = this->dx;
                auVar77._8_8_ = 0;
                auVar77._0_8_ = dVar285;
                auVar152 = vfmadd132sd_fma(auVar223,auVar344,auVar77);
                auVar279._8_8_ = 0;
                auVar279._0_8_ = this->dy;
                auVar78._8_8_ = 0;
                auVar78._0_8_ = auVar334._0_8_;
                auVar153 = vfmadd132sd_fma(auVar279,auVar313,auVar78);
                auVar314._8_8_ = 0;
                auVar314._0_8_ = uVar333;
                auVar79._8_8_ = 0;
                auVar79._0_8_ = local_2a8;
                auVar224._8_8_ = 0;
                auVar224._0_8_ = auVar152._0_8_ - xtarget;
                auVar280._8_8_ = 0;
                auVar280._0_8_ = ((auVar153._0_8_ - y0) - ytarget) * local_228;
                auVar153 = vfmadd231sd_fma(auVar280,auVar224,auVar79);
                auVar225._8_8_ = 0;
                auVar225._0_8_ = this->dz;
                auVar80._8_8_ = 0;
                auVar80._0_8_ = dVar5;
                auVar152 = vfmadd213sd_fma(auVar225,auVar314,auVar80);
                auVar81._8_8_ = 0;
                auVar81._0_8_ = local_1f8._0_8_;
                auVar226._8_8_ = 0;
                auVar226._0_8_ = (auVar152._0_8_ - z0) - ztarget;
                auVar152 = vfmadd132sd_fma(auVar226,auVar153,auVar81);
                dVar147 = cos(dVar149);
                dVar144 = sin(dVar149);
                auVar315._8_8_ = 0;
                auVar315._0_8_ = dVar4;
                auVar82._8_8_ = 0;
                auVar82._0_8_ = dVar147 * dVar238 * (double)local_358._0_8_;
                auVar227._8_8_ = 0;
                auVar227._0_8_ = (double)local_358._0_8_ * dVar144 * dVar142 * local_238;
                auVar154 = vfmadd231sd_fma(auVar227,local_358,auVar82);
                auVar228._8_8_ = 0;
                auVar228._0_8_ = this->dx;
                auVar83._8_8_ = 0;
                auVar83._0_8_ = dVar285;
                auVar153 = vfmadd132sd_fma(auVar228,auVar344,auVar83);
                auVar281._8_8_ = 0;
                auVar281._0_8_ = this->dy;
                auVar84._8_8_ = 0;
                auVar84._0_8_ = auVar334._0_8_;
                auVar134 = vfmadd132sd_fma(auVar281,auVar315,auVar84);
                auVar316._8_8_ = 0;
                auVar316._0_8_ = uVar333;
                auVar85._8_8_ = 0;
                auVar85._0_8_ = local_2a8;
                auVar229._8_8_ = 0;
                auVar229._0_8_ = auVar153._0_8_ - xtarget;
                auVar282._8_8_ = 0;
                auVar282._0_8_ = ((auVar134._0_8_ - y0) - ytarget) * local_228;
                auVar134 = vfmadd231sd_fma(auVar282,auVar229,auVar85);
                auVar230._8_8_ = 0;
                auVar230._0_8_ = this->dz;
                auVar86._8_8_ = 0;
                auVar86._0_8_ = dVar5;
                auVar153 = vfmadd213sd_fma(auVar230,auVar316,auVar86);
                auVar87._8_8_ = 0;
                auVar87._0_8_ = local_1f8._0_8_;
                auVar231._8_8_ = 0;
                auVar231._0_8_ = (auVar153._0_8_ - z0) - ztarget;
                auVar153 = vfmadd132sd_fma(auVar231,auVar134,auVar87);
                dVar147 = sin(dVar149);
                dVar144 = cos(dVar149);
                auVar117._8_8_ = 0;
                auVar117._0_8_ = local_258;
                auVar107._8_8_ = 0x8000000000000000;
                auVar107._0_8_ = 0x8000000000000000;
                auVar134 = vxorpd_avx512vl(auVar117,auVar107);
                local_208 = auVar134._0_8_;
                auVar283._8_8_ = 0;
                auVar283._0_8_ = dVar147 * dVar238;
                auVar88._8_8_ = 0;
                auVar88._0_8_ = local_308;
                auVar232._8_8_ = 0;
                auVar232._0_8_ = dVar144 * local_258;
                auVar134 = vfmsub231sd_fma(auVar232,auVar283,auVar88);
                auVar284._8_8_ = 0;
                auVar284._0_8_ = auVar154._0_8_;
                auVar89._8_8_ = 0;
                auVar89._0_8_ = (auVar152._0_8_ * auVar151._0_8_) / dVar143;
                auVar233._8_8_ = 0;
                auVar233._0_8_ =
                     auVar134._0_8_ * local_2d8 * local_2d8 * ((auVar153._0_8_ * dVar100) / dVar286)
                ;
                auVar151 = vfmadd231sd_fma(auVar233,auVar284,auVar89);
                auVar90._8_8_ = 0;
                auVar90._0_8_ = auVar339._0_8_;
                auVar234._8_8_ = 0;
                auVar234._0_8_ = (auVar343._0_8_ / K) * auVar151._0_8_;
                auVar151 = vfmadd231sd_fma(auVar234,auVar321,auVar90);
                local_268 = auVar151._0_8_;
                local_388._8_8_ = auVar343._8_8_;
                local_388._0_8_ = dVar149;
                dVar147 = dVar141;
                dVar144 = dVar142;
                goto LAB_0010e703;
              }
            }
            else {
              auVar321 = ZEXT816(0);
              dVar148 = 0.0;
            }
          }
          auVar151 = vshufpd_avx(local_118,local_118,1);
          dVar143 = auVar151._0_8_;
          auVar135._0_8_ =
               (ulong)b_sign * auVar321._0_8_ +
               (ulong)!b_sign * (auVar321._0_8_ ^ 0x8000000000000000);
          auVar135._8_8_ = auVar321._8_8_ ^ 0x8000000000000000;
          dVar147 = (double)((ulong)b_sign * (long)dVar148 + (ulong)!b_sign * (long)-dVar148);
          dStack_1b0 = auVar133._8_8_;
          auVar136._0_8_ = (ulong)b_sign * (long)dVar143 + (ulong)!b_sign * (long)-dVar143;
          auVar136._8_8_ = auVar151._8_8_ ^ 0x8000000000000000;
          pcVar94 = (this->ce).p._M_t.
                    super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                    super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar128][lVar129];
          auVar336._8_8_ = 0;
          auVar336._0_8_ = local_1b8 * dVar143;
          auVar321 = vfmadd231sd_fma(auVar336,auVar349,auVar342);
          auVar321 = vfmadd231sd_fma(auVar321,auVar102,local_118);
          auVar340._8_8_ = 0;
          auVar340._0_8_ = local_248 * dVar143;
          if (append) {
            auVar91._8_8_ = 0;
            auVar91._0_8_ = dVar320;
            auVar151 = vfmadd231sd_fma(auVar340,auVar349,auVar91);
            auVar151 = vfmadd231sd_fma(auVar151,local_118,auVar101);
            auVar321 = vunpcklpd_avx(auVar321,auVar151);
            pdVar2 = (double *)((long)&pcVar94->ex + lVar127);
            dVar144 = pdVar2[1];
            auVar328._8_8_ = 0;
            auVar328._0_8_ = local_320 * dVar143;
            auVar151 = vfmadd231sd_fma(auVar328,auVar239,auVar349);
            pdVar3 = (double *)((long)&pcVar94->ex + lVar127);
            *pdVar3 = auVar321._0_8_ + *pdVar2;
            pdVar3[1] = auVar321._8_8_ + dVar144;
            auVar337._8_8_ = auVar135._0_8_;
            auVar337._0_8_ = auVar135._0_8_;
            auVar321 = vfmadd231sd_fma(auVar151,local_118,local_1f8);
            *(double *)((long)&pcVar94->ez + lVar127) =
                 auVar321._0_8_ + *(double *)((long)&pcVar94->ez + lVar127);
            auVar329._0_8_ = local_1b8 * dVar147;
            auVar329._8_8_ = dStack_1b0 * dVar147;
            auVar321 = vfmadd132pd_fma(auVar337,auVar329,auVar132);
            auVar330._8_8_ = auVar136._0_8_;
            auVar330._0_8_ = auVar136._0_8_;
            auVar317._8_8_ = 0;
            auVar317._0_8_ = local_320 * dVar147;
            auVar151 = vfmadd231sd_fma(auVar317,auVar239,auVar135);
            auVar151 = vfmadd231sd_fma(auVar151,local_1f8,auVar136);
            pcVar95 = (this->cb).p._M_t.
                      super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                      super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar128][lVar129];
            auVar321 = vfmadd213pd_fma(auVar330,auVar102,auVar321);
            pdVar2 = (double *)((long)&pcVar95->bx + lVar127);
            dVar147 = pdVar2[1];
            pdVar3 = (double *)((long)&pcVar95->bx + lVar127);
            *pdVar3 = auVar321._0_8_ + *pdVar2;
            pdVar3[1] = auVar321._8_8_ + dVar147;
            *(double *)((long)&pcVar95->bz + lVar127) =
                 auVar151._0_8_ + *(double *)((long)&pcVar95->bz + lVar127);
          }
          else {
            *(long *)((long)&pcVar94->ex + lVar127) = auVar321._0_8_;
            auVar321 = vfmadd231sd_fma(auVar340,auVar349,auVar287);
            auVar321 = vfmadd231sd_fma(auVar321,local_118,auVar101);
            *(long *)((long)&pcVar94->ey + lVar127) = auVar321._0_8_;
            auVar331._8_8_ = 0;
            auVar331._0_8_ = local_320 * dVar143;
            auVar321 = vfmadd231sd_fma(auVar331,auVar239,auVar349);
            auVar321 = vfmadd231sd_fma(auVar321,local_118,local_1f8);
            *(long *)((long)&pcVar94->ez + lVar127) = auVar321._0_8_;
            auVar332._8_8_ = 0;
            auVar332._0_8_ = local_1b8 * dVar147;
            auVar321 = vfmadd231sd_fma(auVar332,auVar135,auVar342);
            auVar347._8_8_ = 0;
            auVar347._0_8_ = local_248 * dVar147;
            auVar151 = vfmadd231sd_fma(auVar347,auVar135,auVar287);
            auVar318._8_8_ = 0;
            auVar318._0_8_ = local_320 * dVar147;
            auVar152 = vfmadd231sd_fma(auVar318,auVar239,auVar135);
            auVar321 = vfmadd231sd_fma(auVar321,auVar136,auVar102);
            auVar151 = vfmadd231sd_fma(auVar151,auVar136,auVar101);
            auVar152 = vfmadd231sd_fma(auVar152,local_1f8,auVar136);
            pcVar95 = (this->cb).p._M_t.
                      super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                      super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar128][lVar129];
            *(long *)((long)&pcVar95->bx + lVar127) = auVar321._0_8_;
            *(long *)((long)&pcVar95->by + lVar127) = auVar151._0_8_;
            *(long *)((long)&pcVar95->bz + lVar127) = auVar152._0_8_;
            in_XMM13_Qb = uStack_240;
          }
        }
        auVar319 = ZEXT864((ulong)dVar285);
        auVar338._8_8_ = 0;
        auVar338._0_8_ = auVar334._0_8_;
        lVar127 = lVar127 + 0x18;
      }
    }
    lVar128 = lVar128 + 1;
  } while( true );
}

Assistant:

void spatial_region::f_init_focused(double a0y, double a0z, double xsigma, double sigma0, double x0, double x1, bool b_sign, double phase, double y0, double z0, bool append, double phi, int sscos, double K, double xtarget, double ytarget, double ztarget)
{
    /* sigma0 - поперечный размер в перетяжке (импульс
     * аксиально-симметричный), x0 - положение центра лазерного
     * импульса, x1 - координата по x центра лазерного импульса
     * относительно центра перетяжки */
    /* y0, z0 - смещение центра импульса от оси области,
     * обеспечивающее нужный угол падения. Поворот импульса
     * производится так, что ey остаётся лежать в плоскости xy */
    /* ey задаётся симметричным (если бы импульс был плоским), ez -
     * антисимметричным (по продольной координате) */
    /* Интеграл от квадратов полей не вычисляется аналитически в
     * простой форме, поэтому используется \int a^2 dV. Поля задаются
     * таким образом, чтобы \int a^2 dV имел то же значение, что и для
     * f_init_gauss, поэтому вместо xsigma, ysigma и zsigma для
     * описания огибающей используются половины полных размеров
     * импульса xs и s (половина поперечного размера) */
    // K is a wavevector, K = 1 for first harmonic and 2 for the second.
    double sign = (x1<=0)-(x1>0);
    x1 = sqrt(x1*x1+y0*y0+z0*z0);
    if (x1==0) x1 = dx; // иначе не определён угол поворота импульса
    double xR = K * sigma0*sigma0/2;
    double sigma = sigma0*sqrt(1+x1*x1/xR/xR); // в начальном положении
    // ratio of first and second harmonics beam sizes at initial position
    double a_multiplier = sqrt(1 + x1 * x1 / (sigma0 * sigma0 * sigma0 * sigma0 / 4)) / sqrt(1 + x1 * x1 / (xR * xR));
    double xs = xsigma*2*sqrt(2*PI)/3;
    if ( sscos == 1 )
        xs = 0.822*xsigma;
    double s = sigma/2/sqrt(((double)3)/16-1/PI/PI);
    double s0 = sigma0/2/sqrt(((double)3)/16-1/PI/PI);
    double y12,z12;
    y12 = ny*dy/2;
    z12 = nz*dz/2;
    double r0x,r0y,r0z;
    r0x = sign*sqrt(x1*x1-y0*y0-z0*z0);
    r0x = r0x/x1;
    r0y = -y0/x1;
    r0z = -z0/x1;
    double y0x,y0y,y0z,z0x,z0y,z0z;
    y0z = sqrt( r0x*r0x + r0y*r0y );
    if (y0z!=0)
    {
        y0x = -r0y/y0z;
        y0y = r0x/y0z;
        y0z = 0;
    }
    else
    {
        y0x = 0;
        y0y = 1;
        y0z = 0;
    }
    z0x = r0y*y0z - r0z*y0y;
    z0y = r0z*y0x - r0x*y0z;
    z0z = r0x*y0y - r0y*y0x;
    if (phi!=0) {
        double c,s,yx,yy,yz,zx,zy,zz;
        c = cos(phi);
        s = sin(phi);
        yx = y0x;
        yy = y0y;
        yz = y0z;
        zx = z0x;
        zy = z0y;
        zz = z0z;
        y0x = yx*c + zx*s;
        y0y = yy*c + zy*s;
        y0z = yz*c + zz*s;
        z0x = zx*c - yx*s;
        z0y = zy*c - yy*s;
        z0z = zz*c - yz*s;
    }
    double xi,x,r,cosx,cosr,sinx,sinr;
    double slocal,alocal;
    double ex,ey,ez,bx,by,bz;
    for(int i=0;i<nx;i++)
    {
        for(int j=0;j<ny;j++)
        {
            for(int k=0;k<nz;k++)
            {
                x = r0x*(i*dx-x0-xtarget) + r0y*(j*dy-y12-y0-ytarget) + r0z*(k*dz-z12-z0-ztarget);
                r = sqrt( (i*dx-x0-xtarget)*(i*dx-x0-xtarget) + (j*dy-y12-y0-ytarget)*(j*dy-y12-y0-ytarget) + (k*dz-z12-z0-ztarget)*(k*dz-z12-z0-ztarget) - x*x );
                xi = x + r*r/2*(x-x1)/((x-x1)*(x-x1)+xR*xR) - atan((x-x1)/xR) - atan(x1/xR);
                slocal = s0*sqrt( 1 + (xi-x1+atan(x1/xR))*(xi-x1+atan(x1/xR))/(xR*xR) );
                alocal = s/slocal * a_multiplier;
                if ( xi>-xs && xi<xs && r<slocal )
                {
                    if ( sscos == 1 ) {
                        cosx = cos(PI*xi*xi*xi*xi/2/(xs*xs*xs*xs));
                        cosr = cos(PI*r/2/slocal);
                        sinx = sin(PI*xi*xi*xi*xi/2/(xs*xs*xs*xs));
                        sinr = sin(PI*r/2/slocal);
                        double xxi = K * xi + phase;
                        // envelope = (cosx*cosr)^2;
                        ey = alocal*a0y*cosr*cosr / K * (K * cos(xxi)*cosx*cosx - 4*PI*xi*xi*xi/(xs*xs*xs*xs)*sin(xxi)*cosx*sinx);
                        ez = -alocal*a0z*cosr*cosr / K * (K * sin(xxi)*cosx*cosx + 4*PI*xi*xi*xi/(xs*xs*xs*xs)*cos(xxi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        if (r!=0)
                            ex = alocal*a0y / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)/r*( K * sin(xxi)*cosx*cosx+4*PI*xi*xi*xi/(xs*xs*xs*xs)*cos(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * cos(xxi))+4*PI*xi*xi*xi/(xs*xs*xs*xs)*cosx*sinx*sin(xxi)) ) - alocal*a0z / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)/r*((-K * cos(xxi))*cosx*cosx-4*PI*xi*xi*xi/(xs*xs*xs*xs)*sin(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * sin(xxi))-4*PI*xi*xi*xi/(xs*xs*xs*xs)*cosx*sinx*cos(xxi)) );
                        else
                            ex = 0;
                        if (r!=0)
                            bx = alocal*a0y / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)/r*(K * sin(xxi)*cosx*cosx+4*PI*xi*xi*xi/(xs*xs*xs*xs)*cos(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * cos(xxi))+4*PI*xi*xi*xi/(xs*xs*xs*xs)*cosx*sinx*sin(xxi)) ) + alocal*a0z / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)/r*((-K * cos(xxi))*cosx*cosx-4*PI*xi*xi*xi/(xs*xs*xs*xs)*sin(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * sin(xxi))-4*PI*xi*xi*xi/(xs*xs*xs*xs)*cosx*sinx*cos(xxi)) );
                        else
                            bx = 0;
                    } else if (-2 * s0 * (x1 - x) / xR <= r && r <= 2 * s0 * (x1 - x) / xR) { // otherwise unphysical wings arise
                        cosx = cos(PI*xi/2/xs);
                        cosr = cos(PI*r/2/slocal);
                        sinx = sin(PI*xi/2/xs);
                        sinr = sin(PI*r/2/slocal);
                        double xxi = K * xi + phase;
                        // envelope = (cosx*cosr)^2;
                        ey = alocal*a0y*cosr*cosr / K * (K * cos(xxi)*cosx*cosx - PI/xs*sin(xxi)*cosx*sinx);
                        ez = -alocal*a0z*cosr*cosr / K * (K * sin(xxi)*cosx*cosx + PI/xs*cos(xxi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        if (r!=0)
                            ex = alocal*a0y / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)/r*(K * sin(xxi)*cosx*cosx+PI/xs*cos(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * cos(xxi))+PI/xs*cosx*sinx*sin(xxi)) ) - alocal*a0z / K *( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)/r*((-K * cos(xxi))*cosx*cosx-PI/xs*sin(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * sin(xxi))-PI/xs*cosx*sinx*cos(xxi)) );
                        else
                            ex = 0;
                        if (r!=0)
                            bx = alocal*a0y / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)/r*(K * sin(xxi)*cosx*cosx+PI/xs*cos(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * cos(xxi))+PI/xs*cosx*sinx*sin(xxi)) ) + alocal*a0z / K *( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)/r*((-K * cos(xxi))*cosx*cosx-PI/xs*sin(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * sin(xxi))-PI/xs*cosx*sinx*cos(xxi)) );
                        else
                            bx = 0;
                    } else {
                        ex = 0;
                        ey = 0;
                        ez = 0;
                        bx = 0;
                        by = 0;
                        bz = 0;
                    }
                    if (b_sign==0)
                    {
                        bx = -bx;
                        by = -by;
                        bz = -bz;
                    }
                    if (append==0)
                    {
                        // прежние значения перезаписываются
                        ce[i][j][k].ex = ex*r0x + ey*y0x + ez*z0x;
                        ce[i][j][k].ey = ex*r0y + ey*y0y + ez*z0y;
                        ce[i][j][k].ez = ex*r0z + ey*y0z + ez*z0z;
                        cb[i][j][k].bx = bx*r0x + by*y0x + bz*z0x;
                        cb[i][j][k].by = bx*r0y + by*y0y + bz*z0y;
                        cb[i][j][k].bz = bx*r0z + by*y0z + bz*z0z;
                    }
                    else
                    {
                        // импульс добавляется к имеющимся полям
                        ce[i][j][k].ex += ex*r0x + ey*y0x + ez*z0x;
                        ce[i][j][k].ey += ex*r0y + ey*y0y + ez*z0y;
                        ce[i][j][k].ez += ex*r0z + ey*y0z + ez*z0z;
                        cb[i][j][k].bx += bx*r0x + by*y0x + bz*z0x;
                        cb[i][j][k].by += bx*r0y + by*y0y + bz*z0y;
                        cb[i][j][k].bz += bx*r0z + by*y0z + bz*z0z;
                    }
                }
                else if (append==0)
                {
                    ce[i][j][k].ex = 0;
                    ce[i][j][k].ey = 0;
                    ce[i][j][k].ez = 0;
                    cb[i][j][k].bx = 0;
                    cb[i][j][k].by = 0;
                    cb[i][j][k].bz = 0;
                }
            }
        }
    }
}